

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-sell.c
# Opt level: O3

_Bool borg_object_similar(borg_item_conflict *o_ptr,borg_item_conflict *j_ptr)

{
  byte bVar1;
  char *__s1;
  char *__s2;
  _Bool _Var2;
  int iVar3;
  long lVar4;
  
  if (o_ptr->kind != j_ptr->kind) {
    return false;
  }
  bVar1 = o_ptr->iqty;
  _Var2 = flag_is_equal(o_ptr->flags,j_ptr->flags,5);
  if (!_Var2) {
    return false;
  }
  lVar4 = 0;
  do {
    if (o_ptr->el_info[lVar4].res_level != j_ptr->el_info[lVar4].res_level) {
      return false;
    }
    if (((j_ptr->el_info[lVar4].flags ^ o_ptr->el_info[lVar4].flags) & 3) != 0) {
      return false;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x19);
  switch(o_ptr->tval) {
  case '\x01':
    goto switchD_00243227_caseD_1;
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x15':
    if (o_ptr->aware != true) {
      return false;
    }
    if (j_ptr->aware != true) {
      return false;
    }
  case '\x02':
  case '\x03':
  case '\x04':
    if (o_ptr->to_h != j_ptr->to_h) {
      return false;
    }
    if (o_ptr->to_d != j_ptr->to_d) {
      return false;
    }
    if (o_ptr->to_a != j_ptr->to_a) {
      return false;
    }
    lVar4 = 0;
    do {
      if (o_ptr->modifiers[lVar4] != j_ptr->modifiers[lVar4]) {
        return false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    if (o_ptr->cursed != j_ptr->cursed) {
      return false;
    }
    if (o_ptr->uncursable != j_ptr->uncursable) {
      return false;
    }
    if (o_ptr->cursed != false) {
      lVar4 = 0;
      do {
        if (o_ptr->curses[lVar4] != j_ptr->curses[lVar4]) {
          return false;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x1c);
    }
    if (o_ptr->art_idx != j_ptr->art_idx) {
      return false;
    }
    if (o_ptr->ego_idx != j_ptr->ego_idx) {
      return false;
    }
    _Var2 = flag_is_empty(o_ptr->flags,5);
    if (!_Var2) {
      return false;
    }
    _Var2 = flag_is_empty(j_ptr->flags,5);
    if (!_Var2) {
      return false;
    }
    if (o_ptr->timeout != 0) {
      return false;
    }
    if (j_ptr->timeout != 0) {
      return false;
    }
    if (o_ptr->ac != j_ptr->ac) {
      return false;
    }
    if (o_ptr->dd != j_ptr->dd) {
      return false;
    }
    if (o_ptr->ds != j_ptr->ds) {
      return false;
    }
    break;
  case '\x16':
  case '\x17':
    if (o_ptr->aware != true) {
      return false;
    }
    if (j_ptr->aware == false) {
      return false;
    }
    break;
  case '\x18':
  case '\x19':
  case '\x1a':
  case '\x1c':
    break;
  default:
    if (o_ptr->aware != true) {
      return false;
    }
    if (j_ptr->aware != true) {
      return false;
    }
  }
  if (o_ptr->ident == j_ptr->ident) {
    __s1 = o_ptr->note;
    __s2 = j_ptr->note;
    if (__s1 == (char *)0x0) {
      if (__s2 == (char *)0x0) goto LAB_002433c4;
    }
    else if (((__s2 != (char *)0x0) &&
             (((*__s1 == '\0' || (*__s2 == '\0')) || (iVar3 = strcmp(__s1,__s2), iVar3 == 0)))) &&
            (iVar3 = strcmp(__s1,__s2), iVar3 == 0)) {
LAB_002433c4:
      return (int)(bVar1 + 1) < (k_info[o_ptr->kind].base)->max_stack;
    }
  }
switchD_00243227_caseD_1:
  return false;
}

Assistant:

static bool borg_object_similar(borg_item *o_ptr, borg_item *j_ptr)
{
    /* NOTE: This assumes the giving of one item at a time */
    int total = o_ptr->iqty + 1;
    int i;

    /* Require identical object types */
    if (o_ptr->kind != j_ptr->kind)
        return 0;

    /* Different flags don't stack */
    if (!of_is_equal(o_ptr->flags, j_ptr->flags)) {
        return false;
    }

    /* Different elements don't stack */
    for (i = 0; i < ELEM_MAX; ++i) {
        if (o_ptr->el_info[i].res_level != j_ptr->el_info[i].res_level) {
            return false;
        }
        if ((o_ptr->el_info[i].flags & (EL_INFO_HATES | EL_INFO_IGNORE))
                != (j_ptr->el_info[i].flags & (EL_INFO_HATES | EL_INFO_IGNORE))) {
            return false;
        }
    }

    /* Analyze the items */
    switch (o_ptr->tval) {
        /* Chests */
    case TV_CHEST: {
        /* Never okay */
        return 0;
    }

    /* Food and Potions and Scrolls */
    case TV_FOOD:
    case TV_POTION:
    case TV_SCROLL: {
        /* Assume okay */
        break;
    }

    /* Staffs and Wands */
    case TV_STAFF:
    case TV_WAND: {
        /* Require knowledge */
        if ((!o_ptr->aware) || (!j_ptr->aware))
            return 0;

        /* Fall through */
    }

    /* Staffs and Wands and Rods */
    case TV_ROD: {
        /* Require permission */
        /*            if (!testing_stack) return 0;*/

        /* Require identical charges */
        /*            if (o_ptr->pval != j_ptr->pval) return 0; */

        /* Probably okay */
        break;
    }

    /* Weapons and Armor */
    case TV_BOW:
    case TV_DIGGING:
    case TV_HAFTED:
    case TV_POLEARM:
    case TV_SWORD:
    case TV_BOOTS:
    case TV_GLOVES:
    case TV_HELM:
    case TV_CROWN:
    case TV_SHIELD:
    case TV_CLOAK:
    case TV_SOFT_ARMOR:
    case TV_HARD_ARMOR:
    case TV_DRAG_ARMOR: {
        /* Require permission */
        /*            if (!testing_stack) return 0;*/

        /* XXX XXX XXX Require identical "sense" status */
        /* if ((o_ptr->ident & ID_SENSE) != */
        /*     (j_ptr->ident & ID_SENSE)) return 0; */

        /* Fall through */
    }

    /* Rings, Amulets, Lites */
    case TV_RING:
    case TV_AMULET:
    case TV_LIGHT:
        /* Require full knowledge of both items */
        if ((!o_ptr->aware) || (!j_ptr->aware))
            return 0;
        /* fall through */
        /* Missiles */
    case TV_BOLT:
    case TV_ARROW:
    case TV_SHOT: {
        /* Require identical "bonuses" */
        if (o_ptr->to_h != j_ptr->to_h)
            return false;
        if (o_ptr->to_d != j_ptr->to_d)
            return false;
        if (o_ptr->to_a != j_ptr->to_a)
            return false;

        /* Require identical modifiers */
        for (i = 0; i < OBJ_MOD_MAX; ++i) {
            if (o_ptr->modifiers[i] != j_ptr->modifiers[i]) {
                return false;
            }
        }

        /*
         * Require identical curses; note that curse powers are not
         * available so this is not the same as what object_similar() does
         */
        if (o_ptr->cursed != j_ptr->cursed
                || o_ptr->uncursable != j_ptr->uncursable) {
            return false;
        }
        if (o_ptr->cursed) {
            for (i = 0; i < BORG_CURSE_MAX; ++i) {
                if (o_ptr->curses[i] != j_ptr->curses[i]) {
                    return false;
                }
            }
        }

        /* Require identical "artifact" names */
        if (o_ptr->art_idx != j_ptr->art_idx)
            return false;

        /* Require identical "ego-item" names */
        if (o_ptr->ego_idx != j_ptr->ego_idx)
            return false;

        /* Hack -- Never stack "powerful" items */
        if (!of_is_empty(o_ptr->flags) || !of_is_empty(j_ptr->flags))
            return false;

        /* Hack -- Never stack recharging items */
        if (o_ptr->timeout || j_ptr->timeout)
            return false;

        /* Require identical "values" */
        if (o_ptr->ac != j_ptr->ac)
            return false;
        if (o_ptr->dd != j_ptr->dd)
            return false;
        if (o_ptr->ds != j_ptr->ds)
            return false;

        /* Probably okay */
        break;
    }

    /* Various */
    default: {
        /* Require knowledge */
        if ((!o_ptr->aware) || (!j_ptr->aware))
            return 0;

        /* Probably okay */
        break;
    }
    }

    /* Hack -- Require identical "broken" status */
    if ((o_ptr->ident) != (j_ptr->ident))
        return 0;

    /* The stuff with 'note' is not right but it is close.  I think it */
    /* has him assuming that he can't stack sometimes when he can.  This */
    /* is alright, it just causes him to take a bit more time to do */
    /* some exchanges. */
    /* Hack -- require semi-matching "inscriptions" */
    if ((o_ptr->note && !j_ptr->note) || (!o_ptr->note && j_ptr->note))
        return 0;

    if (o_ptr->note && j_ptr->note) {
        if (o_ptr->note[0] && j_ptr->note[0]
            && (!streq(o_ptr->note, j_ptr->note)))
            return 0;

        /* Hack -- normally require matching "inscriptions" */
        if ((!streq(o_ptr->note, j_ptr->note)))
            return 0;
    }

    /* Maximal "stacking" limit */
    if (total >= k_info[o_ptr->kind].base->max_stack)
        return 0;

    /* They match, so they must be similar */
    return true;
}